

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcondensedcompel.cpp
# Opt level: O0

void __thiscall TPZCondensedCompEl::LoadSolution(TPZCondensedCompEl *this)

{
  _func_int **pp_Var1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  TPZCompMesh *pTVar5;
  TPZFMatrix<double> *pTVar6;
  TPZConnect *pTVar7;
  double *pdVar8;
  long *in_RDI;
  pair<long,_long> pVar9;
  int ibl_1;
  int blsize_1;
  int64_t seqnum_1;
  TPZConnect *c_1;
  int64_t cindex;
  int ic_1;
  int ibl;
  int64_t firsteq;
  int blsize;
  int64_t seqnum;
  TPZConnect *c;
  int ic;
  TPZFNMatrix<60,_double> elsol;
  TPZFMatrix<double> u1;
  int64_t count;
  TPZFMatrix<double> *sol;
  TPZBlock *bl;
  int nc1;
  int nc0;
  int nc;
  int dim1;
  int dim0;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  TPZSolutionMatrix *in_stack_fffffffffffffba0;
  TPZFMatrix<double> *in_stack_fffffffffffffbb0;
  long in_stack_fffffffffffffbb8;
  TPZFMatrix<double> *in_stack_fffffffffffffbc0;
  double *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  int64_t in_stack_fffffffffffffbd8;
  TPZFNMatrix<60,_double> *in_stack_fffffffffffffbe0;
  double *in_stack_fffffffffffffbe8;
  int64_t in_stack_fffffffffffffbf0;
  int64_t in_stack_fffffffffffffbf8;
  TPZFMatrix<double> *in_stack_fffffffffffffc00;
  double dVar10;
  int local_3a8;
  int local_388;
  int local_384;
  int local_360;
  TPZCompEl *in_stack_fffffffffffffd80;
  TPZFMatrix<double> *in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZMatRed<double,_TPZFMatrix<double>_> *in_stack_fffffffffffffda0;
  
  TPZCompEl::LoadSolution((TPZCompEl *)in_stack_fffffffffffffba0);
  iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 7));
  iVar4 = TPZMatRed<double,_TPZFMatrix<double>_>::Dim1
                    ((TPZMatRed<double,_TPZFMatrix<double>_> *)(in_RDI + 7));
  if (iVar3 == iVar4) {
    TPZVec<long>::size((TPZVec<long> *)(in_RDI + 0x6c));
    iVar3 = TPZVec<long>::size((TPZVec<long> *)(in_RDI + 0xae));
    iVar4 = TPZVec<long>::size((TPZVec<long> *)(in_RDI + 0xe9));
    pTVar5 = TPZCompEl::Mesh(in_stack_fffffffffffffd80);
    TPZCompMesh::Block(pTVar5);
    pTVar5 = TPZCompEl::Mesh(in_stack_fffffffffffffd80);
    TPZCompMesh::Solution(pTVar5);
    pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_fffffffffffffba0);
    TPZFMatrix<double>::TPZFMatrix
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbe8);
    TPZFNMatrix<60,_double>::TPZFNMatrix
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               in_stack_fffffffffffffbc8);
    for (local_360 = 0; local_360 < (int)iVar4; local_360 = local_360 + 1) {
      pTVar7 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_360);
      TPZConnect::SequenceNumber(pTVar7);
      iVar2 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
      if (iVar2 != 0) {
        TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
        for (local_384 = 0; local_384 < iVar2; local_384 = local_384 + 1) {
          pdVar8 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                              (int64_t)in_stack_fffffffffffffbb0);
          dVar10 = *pdVar8;
          pdVar8 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                              (int64_t)in_stack_fffffffffffffbb0);
          *pdVar8 = dVar10;
        }
      }
    }
    TPZMatRed<double,_TPZFMatrix<double>_>::UGlobal
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    pVar9.second = in_stack_fffffffffffffbb8;
    pVar9.first = (long)in_stack_fffffffffffffbc0;
    for (local_388 = 0; local_388 < (int)iVar3; local_388 = local_388 + 1) {
      TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xae),(long)local_388);
      pTVar5 = TPZCompEl::Mesh(in_stack_fffffffffffffd80);
      TPZCompMesh::ConnectVec(pTVar5);
      pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                         ((TPZChunkVector<TPZConnect,_10> *)pVar9.first,pVar9.second);
      TPZConnect::SequenceNumber(pTVar7);
      iVar2 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
      local_3a8 = 0;
      while( true ) {
        if (iVar2 <= local_3a8) break;
        pdVar8 = TPZFMatrix<double>::operator()
                           ((TPZFMatrix<double> *)pVar9.first,pVar9.second,
                            (int64_t)in_stack_fffffffffffffbb0);
        pp_Var1 = (_func_int **)*pdVar8;
        in_stack_fffffffffffffbb0 = pTVar6;
        pVar9 = TPZBlock::at((TPZBlock *)pVar9.first,pVar9.second._4_4_,(int)pVar9.second,
                             (int)((ulong)pTVar6 >> 0x20),(int)pTVar6);
        in_stack_fffffffffffffba0 =
             (TPZSolutionMatrix *)
             TPZMatrix<double>::at
                       ((TPZMatrix<double> *)in_stack_fffffffffffffba0,
                        (pair<long,_long> *)
                        CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        (in_stack_fffffffffffffba0->super_TPZSavable)._vptr_TPZSavable = pp_Var1;
        local_3a8 = local_3a8 + 1;
      }
    }
    (**(code **)(*(long *)in_RDI[0x6b] + 0xc0))();
    TPZFNMatrix<60,_double>::~TPZFNMatrix((TPZFNMatrix<60,_double> *)0x1b0f5b2);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b0f5bf);
  }
  return;
}

Assistant:

void TPZCondensedCompEl::LoadSolution()
{
//    if (fKeepMatrix == false) {
//        fKeepMatrix = true;
//        fCondensed.K00()->Redim(fNumInternalEqs, fNumInternalEqs);
//        fCondensed.Redim(fNumTotalEqs, fNumInternalEqs);
//        TPZElementMatrix ek,ef;
//        CalcStiff(ek, ef);
//        fKeepMatrix = false;
//    }
    // initialize the solution of the constrained connects
    TPZCompEl::LoadSolution();
    
    // if the matrix has not been condensed then nothing to do
    if (fCondensed.Rows() != fCondensed.Dim1())
    {
        return;
    }
    // compute the solution of the internal equations
    int dim0=0, dim1=0;
    int nc = fIndexes.size(),nc0 = fCondensedConnectIndexes.size(), nc1 = fActiveConnectIndexes.size();
//    int ic;
//    for (ic=0; ic<nc ; ic++) {
//        int64_t connectindex = fIndexes[ic];
//        TPZConnect &con = fReferenceCompEl->Connect(connectindex);
//        int sz = con.NShape()*con.NState();
//        if (con.IsCondensed()) {
//#ifdef PZDEBUG
//            if (dim1) {
//                DebugStop();
//            }
//#endif
//            dim0 += sz;
//        }
//        else
//        {
//            dim1 += sz;
//        }
//    }
    dim0 = fNumInternalEqs;
    dim1 = fNumTotalEqs-dim0;
    //TPZBlock &bl = Mesh()->Block();
	TPZBlock &bl = Mesh()->Block();
    TPZFMatrix<STATE> &sol = Mesh()->Solution();
    int64_t count = 0;
    //TPZFMatrix<REAL> u1(dim1,1,0.);
	TPZFMatrix<STATE> u1(dim1,1,0.);
    //TPZFMatrix<REAL> elsol(dim0+dim1,1,0.);
	TPZFNMatrix<60,STATE> elsol(dim0+dim1,1,0.);
    for (int ic=0; ic<nc1 ; ic++) {
        TPZConnect &c = Connect(ic);
        int64_t seqnum = c.SequenceNumber();
        int blsize = bl.Size(seqnum);
        if(blsize)
        {
            int64_t firsteq = bl.Position(seqnum);
            for (int ibl=0; ibl<blsize; ibl++) {
                u1(count++,0) = sol(firsteq+ibl,0);
            }
        }
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        TPZManVector<int64_t,60> u1eq(dim1);
        int64_t count = 0;
        for (int ic=0; ic<nc1 ; ic++) {
            TPZConnect &c = Connect(ic);
            int64_t seqnum = c.SequenceNumber();
            int blsize = bl.Size(seqnum);
            if(blsize)
            {
                int64_t firsteq = bl.Position(seqnum);
                for (int ibl=0; ibl<blsize; ibl++) {
                    u1eq[count++] = firsteq+ibl;
                }
            }
        }
        std::stringstream sout;
        sout << "Computing UGlobal Index " << Index();
        sout << " Norm fK01 " << Norm(fCondensed.K01()) << std::endl;
        TPZVec<STATE> u1vec(dim1);
        for(int i=0; i<u1vec.size(); i++) u1vec[i] = u1(i,0);
        sout << "u1 " << u1vec << std::endl;
        sout << "u1 eq " << u1eq << std::endl;
        for(int i=0; i<dim1; i++) sout << sol(u1eq[i],0) << ' ';
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    fCondensed.UGlobal(u1, elsol);
    count = 0;
    for (int ic=0; ic<nc0 ; ic++) {
        int64_t cindex = fCondensedConnectIndexes[ic];
        TPZConnect &c = Mesh()->ConnectVec()[cindex];
        int64_t seqnum = c.SequenceNumber();
        int blsize = bl.Size(seqnum);
        for (int ibl=0; ibl<blsize; ibl++) {
            sol.at(bl.at(seqnum,0,ibl,0)) = elsol(count++,0);
        }
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "After Computing UGlobal Index " << Index() ;
        sout << " Norm fK01 " << Norm(fCondensed.K01()) << std::endl;
        TPZVec<STATE> u1vec(dim1+dim0);
        for(int i=0; i<u1vec.size(); i++) u1vec[i] = elsol(i,0);
        sout << "elsol " << u1vec;
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    fReferenceCompEl->LoadSolution();
//    if (fKeepMatrix == false) {
//        fCondensed.Redim(0,0);
//        fCondensed.K00()->Redim(0, 0);
//    }

}